

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_bootstrap_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::anon_unknown_0::GenerateAndTest::Run
          (GenerateAndTest *this,FileDescriptor *proto_file,string *file1,string *file2)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  pointer prVar4;
  Nonnull<const_char_*> failure_msg;
  pointer *__ptr;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  AlphaNum *c;
  char *in_R9;
  string_view str;
  string expected_contents;
  string actual_contents;
  iterator it;
  string local_158;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  size_t local_120;
  long local_118 [2];
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [2];
  undefined1 local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  Status local_a8;
  undefined1 local_a0 [32];
  string local_80;
  long *local_60;
  char *local_58;
  long local_50 [2];
  iterator local_40;
  
  local_d8[0] = proto_file != (FileDescriptor *)0x0;
  local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (proto_file == (FileDescriptor *)0x0) {
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_d0;
    testing::Message::Message((Message *)&local_128);
    TestSourceDir_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_128._M_head_impl + 0x10),local_158._M_dataplus._M_p,
               local_158._M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_d8,(AssertionResult *)"proto_file != nullptr",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
               ,0x5a,(char *)local_108);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,local_f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pbVar5 = local_d0;
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
      pbVar5 = local_d0;
    }
  }
  else {
    c = (AlphaNum *)&this->error_;
    bVar2 = Generator::Generate(&this->generator_,proto_file,&this->parameter_,
                                &(this->context_).super_GeneratorContext,(string *)c);
    local_108[0] = bVar2;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar2) {
      this_00 = &(this->context_).files_;
      local_40 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                 ::find<std::__cxx11::string>
                           ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>>>
                             *)this_00,file1);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)this_00);
      local_158._M_dataplus._M_p = (char *)0x0;
      bVar2 = absl::lts_20250127::container_internal::operator==(&local_40,(iterator *)&local_158);
      local_108[0] = !bVar2;
      local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar2) {
        prVar4 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::iterator::operator->(&local_40);
        pbVar5 = (prVar4->second)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        _Var1._M_p = (pbVar5->_M_dataplus)._M_p;
        local_128._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,_Var1._M_p,_Var1._M_p + pbVar5->_M_string_length);
        local_a0._8_8_ = 0;
        local_a0[0x10] = '\0';
        local_a0._0_8_ = (AssertHelperData *)(local_a0 + 0x10);
        TestSourceDir_abi_cxx11_();
        local_158._M_dataplus._M_p = local_58;
        local_158._M_string_length = (size_type)local_60;
        local_108 = (undefined1  [8])0x1;
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x135d829;
        local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (file2->_M_dataplus)._M_p;
        local_d8 = (undefined1  [8])file2->_M_string_length;
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_80,(lts_20250127 *)&local_158,(AlphaNum *)local_108,(AlphaNum *)local_d8,c
                  );
        File::ReadFileToString((File *)&local_a8,&local_80,(string *)local_a0,true);
        if ((StatusRep *)local_a8.rep_ == (StatusRep *)0x1) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                                  (&local_a8,
                                   "File::GetContentsAsText( absl::StrCat(TestSourceDir(), \"/\", physical_filename), &actual_contents, true) is OK"
                                  );
          if ((local_a8.rep_ & 1) == 0) {
            absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_a8.rep_);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        if ((StatusRep *)local_a8.rep_ != (StatusRep *)0x1) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_158,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                     ,0x41,failure_msg);
          str._M_str = "Unable to get ";
          str._M_len = 0xe;
          absl::lts_20250127::log_internal::LogMessage::
          CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                    ((LogMessage *)&local_158,str);
          absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)&local_158,file2);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_158);
        }
        if (local_a0._8_8_ == local_120) {
          if (local_a0._8_8_ == 0) goto LAB_00a66ff4;
          iVar3 = bcmp((void *)local_a0._0_8_,local_128._M_head_impl,local_a0._8_8_);
          local_108[0] = iVar3 == 0;
          local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar3 == 0) goto LAB_00a66ff4;
        }
        else {
          local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
        }
        local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::Message::Message((Message *)local_d8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_d8 + 0x10),(file2->_M_dataplus)._M_p,
                   file2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_d8 + 0x10),
                   " needs to be regenerated.  Please run generate_descriptor_proto.sh. Then add this file to your CL."
                   ,0x62);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_158,(internal *)local_108,
                   (AssertionResult *)"actual_contents == expected_contents","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                   ,0x43,local_158._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_d8 + 8))();
        }
        if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_100,local_100);
        }
LAB_00a66ff4:
        if ((AssertHelperData *)local_a0._0_8_ != (AssertHelperData *)(local_a0 + 0x10)) {
          operator_delete((void *)local_a0._0_8_,CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
        }
        if (local_128._M_head_impl ==
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118) {
          return;
        }
        operator_delete(local_128._M_head_impl,local_118[0] + 1);
        return;
      }
      testing::Message::Message((Message *)local_d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_d8 + 0x10),"Generator failed to generate file: ",0x23);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)((long)local_d8 + 0x10),(file1->_M_dataplus)._M_p,
                 file1->_M_string_length);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)local_108,(AssertionResult *)"it != files_.end()","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                 ,0x3a,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_d8);
    }
    else {
      testing::Message::Message((Message *)local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_158,(internal *)local_108,
                 (AssertionResult *)
                 "generator_.Generate(proto_file, parameter_, &context_, &error_)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_bootstrap_unittest.cc"
                 ,0x5c,local_158._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)local_d8);
    }
    this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_100;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pbVar5 = local_100;
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_d8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      (**(code **)(*(long *)local_d8 + 8))();
      pbVar5 = local_100;
    }
  }
  if (pbVar5 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_01,pbVar5);
  }
  return;
}

Assistant:

void Run(const FileDescriptor* proto_file, std::string file1,
           std::string file2) {
    ASSERT_TRUE(proto_file != nullptr) << TestSourceDir();
    ASSERT_TRUE(generator_.Generate(proto_file, parameter_,
                                    &context_, &error_));
    context_.ExpectFileMatches(file1, file2);
  }